

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiTexShader::setUniforms
          (MultiTexShader *this,Context *ctx,deUint32 program)

{
  uint uVar1;
  uint local_b8;
  deUint32 local_b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string ndxStr;
  
  local_b4 = program;
  (*ctx->_vptr_Context[0x76])(ctx,(ulong)program);
  for (local_b8 = 0; (int)local_b8 < *(int *)&(this->super_ShaderProgram).field_0x154;
      local_b8 = local_b8 + 1) {
    de::toString<int>(&ndxStr,(int *)&local_b8);
    std::operator+(local_b0,"u_sampler",&ndxStr);
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)local_b4,local_b0[0]._M_dataplus._M_p);
    (*ctx->_vptr_Context[0x5b])(ctx,(ulong)uVar1,(ulong)local_b8);
    std::__cxx11::string::~string((string *)local_b0);
    std::operator+(&local_70,"u_trans",&ndxStr);
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)local_b4,local_70._M_dataplus._M_p);
    tcu::Matrix<float,_4,_4>::getColumnMajorData
              ((Array<float,_16> *)local_b0,
               (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)local_b8);
    (*ctx->_vptr_Context[0x65])(ctx,(ulong)uVar1,1,0,local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    std::operator+(local_b0,"u_texScale",&ndxStr);
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)local_b4,local_b0[0]._M_dataplus._M_p);
    (*ctx->_vptr_Context[0x5f])
              (ctx,(ulong)uVar1,1,
               (this->m_texScales).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (int)local_b8);
    std::__cxx11::string::~string((string *)local_b0);
    std::operator+(local_b0,"u_texBias",&ndxStr);
    uVar1 = (*ctx->_vptr_Context[0x66])(ctx,(ulong)local_b4,local_b0[0]._M_dataplus._M_p);
    (*ctx->_vptr_Context[0x5f])
              (ctx,(ulong)uVar1,1,
               (this->m_texBiases).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start + (int)local_b8);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)&ndxStr);
  }
  return;
}

Assistant:

void MultiTexShader::setUniforms (sglr::Context& ctx, deUint32 program) const
{
	ctx.useProgram(program);

	// Sampler and matrix uniforms.

	for (int ndx = 0; ndx < m_numUnits; ndx++)
	{
		string			ndxStr		= de::toString(ndx);

		ctx.uniform1i(ctx.getUniformLocation(program, ("u_sampler" + ndxStr).c_str()), ndx);
		ctx.uniformMatrix4fv(ctx.getUniformLocation(program, ("u_trans" + ndxStr).c_str()), 1, GL_FALSE, (GLfloat*)&m_transformations[ndx].getColumnMajorData()[0]);
		ctx.uniform4fv(ctx.getUniformLocation(program, ("u_texScale" + ndxStr).c_str()), 1, m_texScales[ndx].getPtr());
		ctx.uniform4fv(ctx.getUniformLocation(program, ("u_texBias" + ndxStr).c_str()), 1, m_texBiases[ndx].getPtr());
	}
}